

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

NodePtr __thiscall dh::analysis::proper_para_list(analysis *this)

{
  string *c;
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar2;
  NodePtr tmp_cur_ptr;
  NodePtr tmp_in_ptr;
  __shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> local_80;
  undefined1 local_70 [64];
  
  para_decl(this);
  std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,(__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)this);
  c = (string *)(local_70 + 0x20);
  while( true ) {
    token::getVal_abi_cxx11_
              ((string *)local_70,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_70,",");
    std::__cxx11::string::~string((string *)local_70);
    if (!bVar1) break;
    std::__cxx11::string::string((string *)c,",",(allocator *)local_70);
    match(in_RSI,c);
    std::__cxx11::string::~string((string *)c);
    para_decl((analysis *)local_70);
    TreeNode::setSibling(local_80._M_ptr,(NodePtr *)local_70);
    std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_80,(__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::proper_para_list()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in proper_para_list\n";
#endif
	NodePtr ret = para_decl();

	NodePtr tmp_cur_ptr = ret;
	while(tmp->getVal() == ",")
	{
		match(",");
		NodePtr tmp_in_ptr = para_decl();
		tmp_cur_ptr->setSibling(tmp_in_ptr);
		tmp_cur_ptr = tmp_in_ptr;
	}

	return ret;
}